

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O1

CK_RV __thiscall SessionManager::closeSession(SessionManager *this,CK_SESSION_HANDLE hSession)

{
  Session *pSVar1;
  Slot *pSVar2;
  CK_SLOT_ID CVar3;
  pointer ppSVar4;
  CK_SLOT_ID CVar5;
  Token *this_00;
  ulong uVar6;
  CK_RV CVar7;
  MutexLocker lock;
  MutexLocker MStack_38;
  
  if (hSession == 0) {
    CVar7 = 0xb3;
  }
  else {
    MutexLocker::MutexLocker(&MStack_38,this->sessionsMutex);
    ppSVar4 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    CVar7 = 0xb3;
    if ((hSession <=
         (ulong)((long)(this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)) &&
       (pSVar1 = ppSVar4[hSession - 1], pSVar1 != (Session *)0x0)) {
      pSVar2 = Session::getSlot(pSVar1);
      CVar3 = Slot::getSlotID(pSVar2);
      ppSVar4 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar4) {
        uVar6 = 0;
        do {
          if (ppSVar4[uVar6] != (Session *)0x0) {
            pSVar2 = Session::getSlot(ppSVar4[uVar6]);
            CVar5 = Slot::getSlotID(pSVar2);
            if ((hSession - 1 != uVar6) && (CVar5 == CVar3)) goto LAB_00170632;
          }
          uVar6 = uVar6 + 1;
          ppSVar4 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->sessions).
                                       super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >>
                                3));
      }
      pSVar2 = Session::getSlot((this->sessions).
                                super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                                super__Vector_impl_data._M_start[hSession - 1]);
      this_00 = Slot::getToken(pSVar2);
      Token::logout(this_00);
LAB_00170632:
      pSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
               super__Vector_impl_data._M_start[hSession - 1];
      if (pSVar1 != (Session *)0x0) {
        (*pSVar1->_vptr_Session[1])();
      }
      (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
      super__Vector_impl_data._M_start[hSession - 1] = (Session *)0x0;
      CVar7 = 0;
    }
    MutexLocker::~MutexLocker(&MStack_38);
  }
  return CVar7;
}

Assistant:

CK_RV SessionManager::closeSession(CK_SESSION_HANDLE hSession)
{
	if (hSession == CK_INVALID_HANDLE) return CKR_SESSION_HANDLE_INVALID;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Check if we are out of range
	if (hSession > sessions.size()) return CKR_SESSION_HANDLE_INVALID;

	// Check if it is a closed session
	unsigned long sessionID = hSession - 1;
	if (sessions[sessionID] == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if this is the last session on the token
	bool lastSession = true;
	const CK_SLOT_ID slotID( sessions[sessionID]->getSlot()->getSlotID() );
	for (size_t i = 0; i < sessions.size(); i++)
	{
		if (sessions[i] == NULL) continue;

		if (sessions[i]->getSlot()->getSlotID() == slotID && i != sessionID)
		{
			lastSession = false;
			break;
		}
	}

	// Logout if this is the last session on the token
	if (lastSession)
	{
		sessions[sessionID]->getSlot()->getToken()->logout();
	}

	// Close the session
	delete sessions[sessionID];
	sessions[sessionID] = NULL;

	return CKR_OK;
}